

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_3a11d2::LastChar::~LastChar(LastChar *this)

{
  LastChar *this_local;
  
  ~LastChar(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~LastChar() final = default;